

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::startSeparatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  long lVar1;
  QPoint QVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data *pDVar6;
  int *piVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayoutInfo::findSeparator
            ((QList<int> *)&local_38,(QDockAreaLayoutInfo *)&this[1].hoverSeparator.d.ptr,pos);
  QArrayDataPointer<int>::operator=(&(this->movingSeparator).d,&local_38);
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,4,0x10);
    }
  }
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    this[2].hoverSeparator.d.size = (qsizetype)this[1].hoverSeparator.d.ptr;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&this[2].hoverPos,
               (QArrayDataPointer<QWidget_*> *)&this[1].hoverSeparator.d.size);
    pDVar6 = this[1].movingSeparator.d.d;
    piVar7 = this[1].movingSeparator.d.ptr;
    *(QCursorData **)&this[2].hasOldCursor = this[1].adjustedCursor.d;
    this[2].movingSeparator.d.d = *(Data **)&this[1].hasOldCursor;
    this[2].movingSeparator.d.ptr = (int *)pDVar6;
    this[2].movingSeparator.d.size = (qsizetype)piVar7;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)&this[2].movingSeparatorOrigin,
               (QArrayDataPointer<QDockAreaLayoutItem> *)&this[1].movingSeparator.d.size);
    uVar3 = *(undefined4 *)&this[1].field_0x64;
    uVar4 = *(undefined4 *)&this[2].hoverSeparator.d.d;
    uVar5 = *(undefined4 *)((long)&this[2].hoverSeparator.d.d + 4);
    *(TimerId *)&this[3].hoverSeparator.d.d = this[1].separatorMoveTimer.m_id;
    *(undefined4 *)((long)&this[3].hoverSeparator.d.d + 4) = uVar3;
    *(undefined4 *)&this[3].hoverSeparator.d.ptr = uVar4;
    *(undefined4 *)((long)&this[3].hoverSeparator.d.ptr + 4) = uVar5;
    *(undefined4 *)&this[3].hoverSeparator.d.size = *(undefined4 *)&this[2].hoverSeparator.d.ptr;
    QVar2 = *pos;
    this->movingSeparatorOrigin = QVar2;
    this->movingSeparatorPos = QVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return lVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::startSeparatorMove(const QPoint &pos)
{
    movingSeparator = findSeparator(pos);

    if (movingSeparator.isEmpty())
        return false;

    layout()->savedState = layout()->layoutState;
    movingSeparatorPos = movingSeparatorOrigin = pos;

    return true;
}